

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithimetrics.cpp
# Opt level: O2

void __thiscall ithimetrics::ithimetrics(ithimetrics *this)

{
  bool *pbVar1;
  long lVar2;
  
  ComputeM1::ComputeM1(&this->cm1);
  ComputeM2::ComputeM2(&this->cm2);
  ComputeM3::ComputeM3(&this->cm3);
  ComputeM4::ComputeM4(&this->cm4);
  ComputeM6::ComputeM6(&this->cm6);
  ComputeM7::ComputeM7(&this->cm7);
  ComputeM8::ComputeM8(&this->cm8);
  this->metric_date = (char *)0x0;
  this->ithi_folder = (char *)0x0;
  this->compliance_file_name = (char *)0x0;
  this->root_capture_file_name = (char *)0x0;
  this->recursive_capture_file_name = (char *)0x0;
  this->authoritative_capture_file_name = (char *)0x0;
  this->abuse_file_name_tlds = (char *)0x0;
  this->abuse_file_name_registrars = (char *)0x0;
  this->root_zone_file_name = (char *)0x0;
  for (lVar2 = -0xb; lVar2 != 0; lVar2 = lVar2 + 1) {
    pbVar1 = this->metric_is_available + lVar2 * 8;
    pbVar1[0] = false;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    pbVar1[4] = false;
    pbVar1[5] = false;
    pbVar1[6] = false;
    pbVar1[7] = false;
    this->metric_is_available[lVar2 + 0xb] = false;
  }
  return;
}

Assistant:

ithimetrics::ithimetrics()
    :
    metric_date(NULL),
    ithi_folder(NULL),
    compliance_file_name(NULL),
    root_capture_file_name(NULL),
    recursive_capture_file_name(NULL),
    authoritative_capture_file_name(NULL),
    abuse_file_name_tlds(NULL),
    abuse_file_name_registrars(NULL),
    root_zone_file_name(NULL)
{
    for (int i = 0; i < ITHI_NUMBER_OF_METRICS; i++) {
        metric_file[i] = NULL;
        metric_is_available[i] = false;
    }
}